

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

ssize_t populate_binsettings(uint8_t *binsettings,Curl_easy *data)

{
  ssize_t sVar1;
  nghttp2_settings_entry iv [3];
  
  populate_settings(iv,data);
  sVar1 = nghttp2_pack_settings_payload(binsettings,0x50,iv,3);
  return sVar1;
}

Assistant:

static ssize_t populate_binsettings(uint8_t *binsettings,
                                    struct Curl_easy *data)
{
  nghttp2_settings_entry iv[H2_SETTINGS_IV_LEN];
  int ivlen;

  ivlen = populate_settings(iv, data);
  /* this returns number of bytes it wrote or a negative number on error. */
  return nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                       iv, ivlen);
}